

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_label.cc
# Opt level: O3

char * bufread_simple_label(shared_data *sd,label_data *ld,char *c)

{
  float fVar1;
  float fVar2;
  
  fVar2 = *(float *)c;
  ld->label = fVar2;
  ld->weight = *(float *)(c + 4);
  ld->initial = *(float *)(c + 8);
  if (((fVar2 != 3.4028235e+38) || (NAN(fVar2))) && (sd->is_more_than_two_labels_observed == false))
  {
    fVar1 = sd->first_observed_label;
    if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
      if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
        fVar1 = sd->second_observed_label;
        if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
          if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
            sd->is_more_than_two_labels_observed = true;
          }
        }
        else {
          sd->second_observed_label = fVar2;
        }
      }
    }
    else {
      sd->first_observed_label = fVar2;
    }
  }
  return c + 0xc;
}

Assistant:

char* bufread_simple_label(shared_data* sd, label_data* ld, char* c)
{
  memcpy(&ld->label, c, sizeof(ld->label));
  //  cout << ld->label << " " << sd->is_more_than_two_labels_observed << " " << sd->first_observed_label <<  endl;
  c += sizeof(ld->label);
  memcpy(&ld->weight, c, sizeof(ld->weight));
  c += sizeof(ld->weight);
  memcpy(&ld->initial, c, sizeof(ld->initial));
  c += sizeof(ld->initial);

  count_label(sd, ld->label);
  return c;
}